

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

EnumDescriptorProto_EnumReservedRange *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
          (Arena *arena)

{
  EnumDescriptorProto_EnumReservedRange *this;
  
  if (arena == (Arena *)0x0) {
    this = (EnumDescriptorProto_EnumReservedRange *)operator_new(0x20);
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
    (this->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__EnumDescriptorProto_EnumReservedRange_003b9788;
    this->_has_bits_ = (uint32  [1])0x0;
    this->_cached_size_ = (atomic<int>)0x0;
    this->start_ = 0;
    this->end_ = 0;
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&EnumDescriptorProto_EnumReservedRange::typeinfo,0x20);
    }
    this = (EnumDescriptorProto_EnumReservedRange *)AllocateAlignedNoHook(arena,0x20);
    EnumDescriptorProto_EnumReservedRange::EnumDescriptorProto_EnumReservedRange(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::EnumDescriptorProto_EnumReservedRange* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::EnumDescriptorProto_EnumReservedRange >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::EnumDescriptorProto_EnumReservedRange >(arena);
}